

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O2

err_t rngESHealth(void)

{
  bool bVar1;
  bool bVar2;
  err_t eVar3;
  uint uVar4;
  long lVar5;
  
  eVar3 = rngESHealth2();
  if (eVar3 == 0) {
LAB_00113b97:
    uVar4 = 0;
  }
  else {
    bVar1 = false;
    for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
      eVar3 = rngESTest((char *)((long)&DAT_0014da54 + (long)*(int *)((long)&DAT_0014da54 + lVar5)))
      ;
      bVar2 = bVar1;
      if ((eVar3 == 0) && (bVar2 = true, bVar1)) goto LAB_00113b97;
      bVar1 = bVar2;
    }
    uVar4 = bVar1 | 0x12e;
  }
  return uVar4;
}

Assistant:

err_t rngESHealth()
{
	const char* sources[] = { "sys", "sys2", "timer" };
	size_t valid_sources = 0;
	size_t pos;
	// есть работоспособный физический источник?
	if (rngESHealth2() == ERR_OK)
		return ERR_OK;
	// проверить остальные источники
	for (pos = 0; pos < COUNT_OF(sources); ++pos)
	{
		if (rngESTest(sources[pos]) != ERR_OK)
			continue;
		// два работоспособных источника?
		if (++valid_sources == 2)
			return ERR_OK;
	}
	// только один?
	if (valid_sources == 1)
		return ERR_NOT_ENOUGH_ENTROPY;
	// ни одного
	return ERR_BAD_ENTROPY;
}